

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
::emplace_at<int>(raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                  *this,iterator iter,int *args)

{
  iterator i;
  bool bVar1;
  slot_type *slot;
  reference ts;
  const_iterator local_50;
  FindElement local_40;
  iterator local_38;
  int *local_28;
  int *args_local;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  *this_local;
  iterator iter_local;
  
  iter_local.ctrl_ = (ctrl_t *)iter.field_1;
  this_local = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                *)iter.ctrl_;
  local_28 = args;
  args_local = (int *)this;
  slot = iterator::slot((iterator *)&this_local);
  construct<int>(this,slot,local_28);
  local_40.s = this;
  ts = iterator::operator*((iterator *)&this_local);
  local_38 = (iterator)
             hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,void>
             ::
             apply<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,absl::lts_20250127::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<int>>::FindElement,int_const&,absl::lts_20250127::container_internal::FlatHashSetPolicy<int>>
                       (&local_40,ts);
  i.field_1.slot_ = (slot_type *)iter_local.ctrl_;
  i.ctrl_ = (ctrl_t *)this_local;
  const_iterator::const_iterator(&local_50,i);
  bVar1 = container_internal::operator==((const_iterator *)&local_38,&local_50);
  if (!bVar1) {
    __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xfe2,
                  "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<int>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<int>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashSetPolicy<int>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<int>, Args = <int>]"
                 );
  }
  return;
}

Assistant:

void emplace_at(iterator iter, Args&&... args) {
    construct(iter.slot(), std::forward<Args>(args)...);

    assert(PolicyTraits::apply(FindElement{*this}, *iter) == iter &&
           "constructed value does not match the lookup key");
  }